

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O0

void __thiscall Js::ScriptContext::ClearDynamicProfileList(ScriptContext *this)

{
  Cache *pCVar1;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> **ppSVar2;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *this_00;
  nullptr_t local_18;
  ScriptContext *local_10;
  ScriptContext *this_local;
  
  local_10 = this;
  pCVar1 = Cache(this);
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SListBase__
                      ((WriteBarrierPtr *)&pCVar1->profileInfoList);
  if (*ppSVar2 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
    pCVar1 = Cache(this);
    this_00 = Memory::
              WriteBarrierPtr<SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>_>::
              operator->(&pCVar1->profileInfoList);
    SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Reset(this_00);
    local_18 = (nullptr_t)0x0;
    pCVar1 = Cache(this);
    Memory::WriteBarrierPtr<SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>_>::
    operator=(&pCVar1->profileInfoList,&local_18);
  }
  return;
}

Assistant:

void ClearDynamicProfileList()
        {
            if (this->Cache()->profileInfoList)
            {
                this->Cache()->profileInfoList->Reset();
                this->Cache()->profileInfoList = nullptr;
            }
        }